

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

void __thiscall
HashTable<ObjTypeGuardBucket,Memory::ArenaAllocator>::
Or<ObjTypeGuardBucket(*)(ObjTypeGuardBucket,ObjTypeGuardBucket)>
          (HashTable<ObjTypeGuardBucket,Memory::ArenaAllocator> *this,
          HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *this2,
          _func_ObjTypeGuardBucket_ObjTypeGuardBucket_ObjTypeGuardBucket *fn)

{
  int iVar1;
  code *pcVar2;
  ObjTypeGuardBucket OVar3;
  NodeBase *pNVar4;
  bool bVar5;
  bool bVar6;
  undefined4 *puVar7;
  Type_conflict pSVar8;
  Type *pTVar9;
  ObjTypeGuardBucket local_128;
  ObjTypeGuardBucket local_118;
  Type *local_108;
  Bucket<ObjTypeGuardBucket> *newBucket_1;
  Type local_f8;
  BVSparse<Memory::JitArenaAllocator> *local_f0;
  JITTypeHolder local_e8;
  ObjTypeGuardBucket local_e0;
  BVSparse<Memory::JitArenaAllocator> *local_d0;
  Type local_c8;
  ObjTypeGuardBucket local_c0;
  ObjTypeGuardBucket local_b0;
  Type *local_a0;
  Bucket<ObjTypeGuardBucket> *newBucket;
  Bucket<ObjTypeGuardBucket> *bucket;
  EditingIterator iter;
  Iterator iter2;
  uint i;
  _func_ObjTypeGuardBucket_ObjTypeGuardBucket_ObjTypeGuardBucket *fn_local;
  HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *this2_local;
  HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *this_local;
  
  iter2.current._4_4_ = 0;
  do {
    if (*(uint *)(this + 8) <= iter2.current._4_4_) {
      return;
    }
    SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::Iterator
              ((Iterator *)&iter.last,this2->table + iter2.current._4_4_);
    if (iter2.list ==
        (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar5) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pNVar4 = iter.last;
    pSVar8 = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar5 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                       pNVar4,pSVar8);
    if (bVar5) {
      iter2.list = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0;
    }
    else {
      iter2.list = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                   SListNodeBase<Memory::ArenaAllocator>::Next
                             (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    }
    SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
              ((EditingIterator *)&bucket,
               (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
               (*(long *)(this + 0x10) + (ulong)iter2.current._4_4_ * 0x10));
    while (bVar5 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                   EditingIterator::Next((EditingIterator *)&bucket), bVar5) {
      newBucket = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator
                  ::Data((Iterator *)&bucket);
      while( true ) {
        bVar6 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::
                IsValid((Iterator *)&iter.last);
        bVar5 = false;
        if (bVar6) {
          iVar1 = newBucket->value;
          pTVar9 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)&iter.last);
          bVar5 = iVar1 < pTVar9->value;
        }
        if (!bVar5) break;
        local_a0 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                   EditingIterator::InsertNodeBefore
                             ((EditingIterator *)&bucket,*(ArenaAllocator **)this);
        pTVar9 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator
                 ::Data((Iterator *)&iter.last);
        local_a0->value = pTVar9->value;
        ObjTypeGuardBucket::ObjTypeGuardBucket(&local_c0,(BVSparse<Memory::JitArenaAllocator> *)0x0)
        ;
        pTVar9 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator
                 ::Data((Iterator *)&iter.last);
        local_d0 = (pTVar9->element).guardedPropertyOps;
        local_c8 = (pTVar9->element).monoGuardType.t;
        local_b0 = (*fn)(local_c0,pTVar9->element);
        (local_a0->element).guardedPropertyOps = local_b0.guardedPropertyOps;
        (local_a0->element).monoGuardType.t = local_b0.monoGuardType.t;
        if (iter2.list ==
            (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar5) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        pNVar4 = iter.last;
        pSVar8 = SListNodeBase<Memory::ArenaAllocator>::Next
                           (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar5 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>
                            *)pNVar4,pSVar8);
        if (bVar5) {
          iter2.list = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                       0x0;
        }
        else {
          iter2.list = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                       SListNodeBase<Memory::ArenaAllocator>::Next
                                 (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
      }
      bVar5 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::
              IsValid((Iterator *)&iter.last);
      if (!bVar5) break;
      iVar1 = newBucket->value;
      pTVar9 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::
               Data((Iterator *)&iter.last);
      if (iVar1 == pTVar9->value) {
        local_f0 = (newBucket->element).guardedPropertyOps;
        local_e8.t = (newBucket->element).monoGuardType.t;
        pTVar9 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator
                 ::Data((Iterator *)&iter.last);
        newBucket_1 = (Bucket<ObjTypeGuardBucket> *)(pTVar9->element).guardedPropertyOps;
        local_f8 = (pTVar9->element).monoGuardType.t;
        OVar3.monoGuardType.t = local_e8.t;
        OVar3.guardedPropertyOps = local_f0;
        local_e0 = (*fn)(OVar3,pTVar9->element);
        (newBucket->element).guardedPropertyOps = local_e0.guardedPropertyOps;
        (newBucket->element).monoGuardType.t = local_e0.monoGuardType.t;
        if (iter2.list ==
            (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar5) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        pNVar4 = iter.last;
        pSVar8 = SListNodeBase<Memory::ArenaAllocator>::Next
                           (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar5 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>
                            *)pNVar4,pSVar8);
        if (bVar5) {
          iter2.list = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                       0x0;
        }
        else {
          iter2.list = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                       SListNodeBase<Memory::ArenaAllocator>::Next
                                 (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
      }
    }
    while (bVar5 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::IsValid((Iterator *)&iter.last), bVar5) {
      local_108 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                  EditingIterator::InsertNodeBefore
                            ((EditingIterator *)&bucket,*(ArenaAllocator **)this);
      pTVar9 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::
               Data((Iterator *)&iter.last);
      local_108->value = pTVar9->value;
      ObjTypeGuardBucket::ObjTypeGuardBucket(&local_128,(BVSparse<Memory::JitArenaAllocator> *)0x0);
      pTVar9 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::
               Data((Iterator *)&iter.last);
      local_118 = (*fn)(local_128,pTVar9->element);
      (local_108->element).guardedPropertyOps = local_118.guardedPropertyOps;
      (local_108->element).monoGuardType.t = local_118.monoGuardType.t;
      if (iter2.list ==
          (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      pNVar4 = iter.last;
      pSVar8 = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar5 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *
                         )pNVar4,pSVar8);
      if (bVar5) {
        iter2.list = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0
        ;
      }
      else {
        iter2.list = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                     SListNodeBase<Memory::ArenaAllocator>::Next
                               (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      }
    }
    iter2.current._4_4_ = iter2.current._4_4_ + 1;
  } while( true );
}

Assistant:

void Or(HashTable<T> * this2, Fn fn)
    {
        for (uint i = 0; i < this->tableSize; i++)
        {
            _TYPENAME SListBase<Bucket<T>>::Iterator iter2(&this2->table[i]);
            iter2.Next();
            FOREACH_SLISTBASE_ENTRY_EDITING(Bucket<T>, bucket, &this->table[i], iter)
            {
                while (iter2.IsValid() && bucket.value < iter2.Data().value)
                {
                    Bucket<T> * newBucket = iter.InsertNodeBefore(this->alloc);
                    newBucket->value = iter2.Data().value;
                    newBucket->element = fn(nullptr, iter2.Data().element);
                    iter2.Next();
                }

                if (!iter2.IsValid())
                {
                    break;
                }
                if (bucket.value == iter2.Data().value)
                {
                    bucket.element = fn(bucket.element, iter2.Data().element);
                    iter2.Next();
                }
            } NEXT_SLISTBASE_ENTRY_EDITING;

            while (iter2.IsValid())
            {
                Bucket<T> * newBucket = iter.InsertNodeBefore(this->alloc);
                newBucket->value = iter2.Data().value;
                newBucket->element = fn(nullptr, iter2.Data().element);
                iter2.Next();
            }
        }
    }